

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

int slang::ast::AssertionExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  long lVar1;
  int iVar2;
  AssertionExpr *pAVar3;
  undefined4 extraout_var;
  undefined4 in_register_0000003c;
  long lVar4;
  
  lVar4 = CONCAT44(in_register_0000003c,__fd);
  lVar1 = *(long *)(lVar4 + 0x18);
  pAVar3 = (AssertionExpr *)
           not_null<slang::syntax::PropertyExprSyntax_*>::get
                     ((not_null<slang::syntax::PropertyExprSyntax_*> *)(lVar4 + 0x20));
  iVar2 = bind(pAVar3,(int)__addr,(sockaddr *)(ulong)(lVar1 == 0),0);
  pAVar3 = (AssertionExpr *)CONCAT44(extraout_var,iVar2);
  if (*(DisableIffSyntax **)(lVar4 + 0x18) != (DisableIffSyntax *)0x0) {
    pAVar3 = DisableIffAssertionExpr::fromSyntax
                       (*(DisableIffSyntax **)(lVar4 + 0x18),pAVar3,(ASTContext *)__addr);
    pAVar3->syntax = *(SyntaxNode **)(lVar4 + 0x18);
  }
  if (*(TimingControlSyntax **)(lVar4 + 0x10) != (TimingControlSyntax *)0x0) {
    pAVar3 = ClockingAssertionExpr::fromSyntax
                       (*(TimingControlSyntax **)(lVar4 + 0x10),pAVar3,(ASTContext *)__addr);
    pAVar3->syntax = *(SyntaxNode **)(lVar4 + 0x10);
  }
  return (int)pAVar3;
}

Assistant:

const AssertionExpr& AssertionExpr::bind(const PropertySpecSyntax& syntax,
                                         const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    bool allowDisable = syntax.disable == nullptr;
    auto result = &bind(*syntax.expr, context, allowDisable);

    if (syntax.disable) {
        auto& disable = DisableIffAssertionExpr::fromSyntax(*syntax.disable, *result, context);
        disable.syntax = syntax.disable;
        result = &disable;
    }

    if (syntax.clocking) {
        auto& clocking = ClockingAssertionExpr::fromSyntax(*syntax.clocking, *result, context);
        clocking.syntax = syntax.clocking;
        result = &clocking;
    }

    return *result;
}